

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O2

char * fctstr_clone_lower(char *s)

{
  size_t sVar1;
  char *pcVar2;
  __int32_t **pp_Var3;
  long lVar4;
  
  if (s == (char *)0x0) {
    pcVar2 = (char *)0x0;
  }
  else {
    sVar1 = strlen(s);
    pcVar2 = (char *)malloc(sVar1 + 2);
    for (lVar4 = 0; sVar1 + 1 != lVar4; lVar4 = lVar4 + 1) {
      pp_Var3 = __ctype_tolower_loc();
      pcVar2[lVar4] = (char)(*pp_Var3)[s[lVar4]];
    }
  }
  return pcVar2;
}

Assistant:

static char*
fctstr_clone_lower(char const *s)
{
    char *k =NULL;
    size_t klen =0;
    size_t i;
    if ( s == NULL )
    {
        return NULL;
    }
    klen = strlen(s)+1;
    k = (char*)malloc(sizeof(char)*klen+1);
    for ( i=0; i != klen; ++i )
    {
        k[i] = (char)tolower(s[i]);
    }
    return k;
}